

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStatePdu.cpp
# Opt level: O1

void __thiscall DIS::EntityStatePdu::unmarshal(EntityStatePdu *this,DataStream *dataStream)

{
  char *c;
  pointer *ppAVar1;
  pointer pAVar2;
  pointer pAVar3;
  iterator __position;
  char cVar4;
  pointer pAVar5;
  ArticulationParameter x;
  ArticulationParameter local_48;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_entityID,dataStream);
  DataStream::operator>>(dataStream,&this->_forceId);
  c = &this->_numberOfArticulationParameters;
  DataStream::operator>>(dataStream,c);
  EntityType::unmarshal(&this->_entityType,dataStream);
  EntityType::unmarshal(&this->_alternativeEntityType,dataStream);
  Vector3Float::unmarshal(&this->_entityLinearVelocity,dataStream);
  Vector3Double::unmarshal(&this->_entityLocation,dataStream);
  Orientation::unmarshal(&this->_entityOrientation,dataStream);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  DeadReckoningParameter::unmarshal(&this->_deadReckoningParameters,dataStream);
  Marking::unmarshal(&this->_marking,dataStream);
  DataStream::operator>>(dataStream,&this->_capabilities);
  pAVar2 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar5 = pAVar2;
  if (pAVar3 != pAVar2) {
    do {
      (**pAVar5->_vptr_ArticulationParameter)(pAVar5);
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != pAVar3);
    (this->_articulationParameters).
    super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar2;
  }
  if ('\0' < *c) {
    cVar4 = '\0';
    do {
      ArticulationParameter::ArticulationParameter(&local_48);
      ArticulationParameter::unmarshal(&local_48,dataStream);
      __position._M_current =
           (this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_articulationParameters).
          super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::ArticulationParameter,std::allocator<DIS::ArticulationParameter>>::
        _M_realloc_insert<DIS::ArticulationParameter_const&>
                  ((vector<DIS::ArticulationParameter,std::allocator<DIS::ArticulationParameter>> *)
                   &this->_articulationParameters,__position,&local_48);
      }
      else {
        (__position._M_current)->_vptr_ArticulationParameter =
             (_func_int **)&PTR__ArticulationParameter_0019f588;
        (__position._M_current)->_parameterTypeDesignator = local_48._parameterTypeDesignator;
        (__position._M_current)->_changeIndicator = local_48._changeIndicator;
        (__position._M_current)->_partAttachedTo = local_48._partAttachedTo;
        (__position._M_current)->_parameterType = local_48._parameterType;
        (__position._M_current)->_parameterValue = local_48._parameterValue;
        ppAVar1 = &(this->_articulationParameters).
                   super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      ArticulationParameter::~ArticulationParameter(&local_48);
      cVar4 = cVar4 + '\x01';
    } while (cVar4 < *c);
  }
  return;
}

Assistant:

void EntityStatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _entityID.unmarshal(dataStream);
    dataStream >> _forceId;
    dataStream >> _numberOfArticulationParameters;
    _entityType.unmarshal(dataStream);
    _alternativeEntityType.unmarshal(dataStream);
    _entityLinearVelocity.unmarshal(dataStream);
    _entityLocation.unmarshal(dataStream);
    _entityOrientation.unmarshal(dataStream);
    dataStream >> _entityAppearance;
    _deadReckoningParameters.unmarshal(dataStream);
    _marking.unmarshal(dataStream);
    dataStream >> _capabilities;

     _articulationParameters.clear();
     for(char idx = 0; idx < _numberOfArticulationParameters; idx++)
     {
        ArticulationParameter x;
        x.unmarshal(dataStream);
        _articulationParameters.push_back(x);
     }
}